

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

double __thiscall VCCluster::energyWithItem(VCCluster *this,VCFace *f)

{
  long in_RSI;
  long *in_RDI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  ReturnType RVar1;
  Vector3d zi;
  double a;
  Vector3d ws;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff78;
  Scalar *in_stack_ffffffffffffff80;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_ffffffffffffff88;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffff90;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff98;
  
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            ((double)in_RDI[0xb] + *(double *)(in_RSI + 0x120));
  (**(code **)(*in_RDI + 0x38))(&stack0xffffffffffffff88);
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (this_00,in_stack_ffffffffffffff78);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (this_00,other);
  return (double)this_00 * (double)other + -(RVar1 * 2.0);
}

Assistant:

double VCCluster::energyWithItem(VCFace* f) {
	Vector3d ws = weightedSum + f->center * f->area;
	double a = area + f->area;
	Vector3d zi = center();
	return a * zi.dot(zi) - 2 * zi.dot(ws);
}